

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii_art.c
# Opt level: O2

cf_int_t cfx_art_print(cf_char_t *input,cf_char_t *buff,cf_size_t size,cfx_art_font_t font)

{
  char cVar1;
  cf_size_t cVar2;
  cf_void_t *addr;
  long lVar3;
  cf_size_t cVar4;
  cf_int_t cVar5;
  char *pcVar6;
  cf_char_t *pcVar7;
  ulong uVar8;
  
  cVar5 = -1;
  if (buff != (cf_char_t *)0x0 && input != (cf_char_t *)0x0) {
    cVar2 = cf_strlen(input);
    if (cVar2 != 0) {
      addr = cf_malloc_dbg(cVar2 * 8,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                           ,"cfx_art_print",0xe3);
      lVar3 = 0;
      do {
        cVar1 = input[lVar3];
        pcVar7 = art_tab;
        if ((cVar1 != '\t') && (pcVar7 = art_space, cVar1 != ' ')) {
          if (cVar1 == '\0') {
            lVar3 = 0;
            uVar8 = 0;
            do {
              if (lVar3 == 6) {
                cf_free_dbg(addr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                            ,"cfx_art_print",0x10d);
                buff[uVar8] = '\0';
                return (cf_int_t)uVar8;
              }
              for (cVar4 = 0; cVar4 != cVar2; cVar4 = cVar4 + 1) {
                pcVar6 = *(char **)((long)addr + cVar4 * 8);
                while (*pcVar6 != '\n') {
                  if (size < uVar8) goto LAB_0010140e;
                  buff[uVar8] = *pcVar6;
                  uVar8 = uVar8 + 1;
                  pcVar6 = (char *)(*(long *)((long)addr + cVar4 * 8) + 1);
                  *(char **)((long)addr + cVar4 * 8) = pcVar6;
                }
                *(char **)((long)addr + cVar4 * 8) = pcVar6 + 1;
              }
              buff[uVar8] = '\n';
              uVar8 = uVar8 + 1;
              lVar3 = lVar3 + 1;
            } while( true );
          }
          if (cVar1 < '!') {
LAB_0010140e:
            cf_free_dbg(addr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                        ,"cfx_art_print",0x112);
            *buff = '\0';
            return -1;
          }
          if (font == CFX_ART_FONT_SLANT) {
            pcVar7 = ascii_map_slant_rel +
                     *(int *)(ascii_map_slant_rel + (ulong)((int)cVar1 - 0x21) * 4);
          }
          else {
            pcVar7 = ascii_map_rel + *(int *)(ascii_map_rel + (ulong)((int)cVar1 - 0x21) * 4);
          }
        }
        *(cf_char_t **)((long)addr + lVar3 * 8) = pcVar7;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    cVar5 = 0;
  }
  return cVar5;
}

Assistant:

cf_int_t cfx_art_print(const cf_char_t* input, cf_char_t* buff, cf_size_t size, cfx_art_font_t font) {
    const cf_char_t** pp = CF_NULL_PTR;
    cf_size_t i = 0, j = 0, cnt = 0, len;
    if (input == CF_NULL_PTR || buff == CF_NULL_PTR) return -1;

    len = cf_strlen(input);
    if (len == 0) return 0;

    pp = cf_malloc_z(sizeof(cf_char_t*) * len);

    /* initialize the map pointer */
    i = 0;
    while (*input) {
        if (*input == ' ') {
            pp[i] = art_space;
        } else if (*input == '\t') {
            pp[i] = art_tab;
        } else if (*input < CFX_ART_MAP_BEGIN || *input > CFX_ART_MAP_END) {
            goto CFX_ART_FAIL;
        } else {
            switch (font) {
                case CFX_ART_FONT_SLANT:
                    pp[i] = ascii_map_slant[*input - CFX_ART_MAP_BEGIN];
                    break;
                default:
                    pp[i] = ascii_map[*input - CFX_ART_MAP_BEGIN];
                    break;
            }
        }
        input++;
        i++;
    }

    /* for each line */
    i = 0;
    while (i < CFX_ART_MAX_LINES) {
        /* write one by one */
        j = 0;
        while (j < len) {
            while (*pp[j] != '\n') {
                if (cnt > size) goto CFX_ART_FAIL;
                buff[cnt++] = *pp[j];
                pp[j]++;
            }
            pp[j]++;
            j++;
        }
        buff[cnt++] = '\n';
        i++;
    }
    cf_free(pp);
    buff[cnt] = '\0';
    return cnt;

CFX_ART_FAIL:
    cf_free(pp);
    buff[0] = '\0';
    return -1;
}